

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::vertex_attribf(NegativeTestContext *ctx)

{
  GLuint index;
  int maxVertexAttribs;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  index = NegativeTestContext::getInteger(local_10,0x8869);
  glu::CallLogWrapper::glVertexAttrib1f(&local_10->super_CallLogWrapper,index,0.0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glVertexAttrib2f(&local_10->super_CallLogWrapper,index,0.0,0.0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glVertexAttrib3f(&local_10->super_CallLogWrapper,index,0.0,0.0,0.0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glVertexAttrib4f(&local_10->super_CallLogWrapper,index,0.0,0.0,0.0,0.0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void vertex_attribf (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	int maxVertexAttribs = ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	ctx.glVertexAttrib1f(maxVertexAttribs, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib2f(maxVertexAttribs, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib3f(maxVertexAttribs, 0.0f, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib4f(maxVertexAttribs, 0.0f, 0.0f, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}